

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtag.cpp
# Opt level: O1

string * __thiscall
Jtag::shiftData(string *__return_storage_ptr__,Jtag *this,uint bitCount,string *tdi)

{
  byte bVar1;
  char *__nptr;
  pointer pcVar2;
  sbyte sVar3;
  byte bVar4;
  byte *pbVar5;
  Jtag *pJVar6;
  bool bVar7;
  char cVar8;
  uint i;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined2 *puVar12;
  byte *pbVar13;
  int *piVar14;
  long lVar15;
  BYTE *out;
  ulong uVar16;
  undefined8 uVar17;
  uint uVar18;
  string *psVar19;
  uint uVar20;
  ulong uVar21;
  DWORD dwNumBytesSent;
  DWORD dwNumBytesRead;
  DWORD dwNumBytesToRead;
  stringstream ss;
  undefined4 local_254;
  byte *local_250;
  string *local_248;
  int local_240;
  int local_23c;
  byte *local_238;
  Jtag *local_230;
  ulong local_228;
  uint local_21c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  ulong local_210;
  ulong local_208;
  string *local_200;
  string local_1f8;
  long *local_1d8 [2];
  long local_1c8 [2];
  char *local_1b8 [2];
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  uVar20 = ((bitCount >> 3) + 1) - (uint)((bitCount & 7) == 0);
  local_230 = this;
  puVar12 = (undefined2 *)operator_new__((ulong)(uVar20 + 3));
  local_238 = (byte *)operator_new__((ulong)(uVar20 + 3));
  local_208 = (ulong)uVar20;
  pbVar13 = (byte *)operator_new__((ulong)(uVar20 + 6));
  local_254 = 0;
  local_23c = 0;
  local_240 = 0;
  if (tdi->_M_string_length < (ulong)(((bitCount >> 2) + 1) - (uint)((bitCount & 3) == 0))) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  bVar7 = flush(local_230);
  if (!bVar7) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  local_250 = pbVar13;
  local_248 = __return_storage_ptr__;
  local_228 = (ulong)bitCount;
  local_200 = tdi;
  if (bitCount < 9) {
    __nptr = (tdi->_M_dataplus)._M_p;
    piVar14 = __errno_location();
    iVar9 = *piVar14;
    *piVar14 = 0;
    lVar15 = strtol(__nptr,local_1b8,0x10);
    pJVar6 = local_230;
    pbVar13 = local_238;
    if (local_1b8[0] == __nptr) {
      std::__throw_invalid_argument("stoi");
    }
    else if (((int)(uint)lVar15 == lVar15) && (*piVar14 != 0x22)) {
      if (*piVar14 == 0) {
        *piVar14 = iVar9;
      }
      *(undefined1 *)puVar12 = 0x3b;
      cVar8 = (char)local_228;
      *(char *)((long)puVar12 + 1) = cVar8 + -2;
      *(char *)(puVar12 + 1) = (char)lVar15;
      iVar9 = FT_Write(local_230->ftHandle,puVar12,3,&local_254);
      if (iVar9 == 0) {
        *puVar12 = 0x6e;
        *(byte *)(puVar12 + 1) = (char)((uint)lVar15 >> (cVar8 - 1U & 7)) << 7 | 3;
        iVar9 = FT_Write(pJVar6->ftHandle,puVar12,3,&local_254);
        psVar19 = local_248;
        pbVar5 = local_250;
        if (iVar9 == 0) {
          do {
            iVar9 = FT_GetQueueStatus(pJVar6->ftHandle,&local_23c);
          } while (iVar9 == 0 && local_23c == 0);
          iVar9 = FT_Read(pJVar6->ftHandle,pbVar5,local_23c,&local_240);
          if (iVar9 == 0) {
            bVar1 = *pbVar5 >> (9U - cVar8 & 0x1f);
            *local_238 = bVar1;
            *local_238 = pbVar5[1] >> (8U - cVar8 & 0x1f) | bVar1;
            uVar20 = 1;
            bVar7 = true;
            pbVar13 = local_238;
          }
          else {
            operator_delete(puVar12,1);
            pbVar13 = local_238;
            operator_delete(local_238,1);
            operator_delete(pbVar5,1);
            (psVar19->_M_dataplus)._M_p = (pointer)&psVar19->field_2;
            bVar7 = false;
            std::__cxx11::string::_M_construct<char_const*>((string *)psVar19,"");
            uVar20 = 0;
          }
        }
        else {
          operator_delete(puVar12,1);
          pbVar13 = local_238;
          operator_delete(local_238,1);
          operator_delete(pbVar5,1);
          (psVar19->_M_dataplus)._M_p = (pointer)&psVar19->field_2;
          bVar7 = false;
          std::__cxx11::string::_M_construct<char_const*>((string *)psVar19,"");
          uVar20 = 0;
        }
      }
      else {
        operator_delete(puVar12,1);
        operator_delete(pbVar13,1);
        operator_delete(local_250,1);
        psVar19 = local_248;
        (local_248->_M_dataplus)._M_p = (pointer)&local_248->field_2;
        bVar7 = false;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"");
        uVar20 = 0;
      }
      goto LAB_00111187;
    }
    uVar17 = std::__throw_out_of_range("stoi");
    _Unwind_Resume(uVar17);
  }
  out = (BYTE *)operator_new__((ulong)((int)local_208 + 1));
  pcVar2 = (tdi->_M_dataplus)._M_p;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,pcVar2,pcVar2 + tdi->_M_string_length);
  hexToByte(&local_1f8,out);
  pbVar13 = local_238;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  psVar19 = local_248;
  uVar20 = (int)local_228 - 1;
  if (0x80007 < uVar20) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Large transfers with reads may not work!",0x28);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
  }
  local_218 = &psVar19->field_2;
  iVar9 = 0;
  uVar18 = uVar20 >> 3;
  local_21c = uVar18;
  local_210 = (ulong)uVar20;
  for (; pJVar6 = local_230, uVar18 != 0; uVar18 = uVar18 - iVar11) {
    uVar21 = 0x10000;
    if (uVar18 < 0x10000) {
      uVar21 = (ulong)uVar18;
    }
    *(undefined1 *)puVar12 = 0x39;
    iVar11 = (int)uVar21;
    *(char *)((long)puVar12 + 1) = (char)(iVar11 + -1);
    *(char *)(puVar12 + 1) = (char)((uint)(iVar11 + -1) >> 8);
    uVar16 = 0;
    do {
      *(BYTE *)((long)puVar12 + uVar16 + 3) = out[(uint)(iVar9 + (int)uVar16)];
      uVar16 = uVar16 + 1;
    } while (uVar21 != uVar16);
    iVar10 = FT_Write(local_230->ftHandle,puVar12,iVar11 + 3,&local_254);
    if (iVar10 != 0) {
      operator_delete(puVar12,1);
      pbVar13 = local_238;
      operator_delete(local_238,1);
      operator_delete(local_250,1);
      operator_delete(out,1);
      (local_248->_M_dataplus)._M_p = (pointer)local_218;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"");
      bVar7 = false;
      uVar20 = 0;
      psVar19 = local_248;
      goto LAB_00111187;
    }
    iVar9 = iVar9 + iVar11;
    pbVar13 = local_238;
  }
  uVar20 = (uint)local_210 & 7;
  iVar9 = ((uint)local_210 & 0xfffffff8) + 1;
  sVar3 = (sbyte)uVar20;
  if (iVar9 != (int)local_228) {
    *(undefined1 *)puVar12 = 0x3b;
    *(sbyte *)((long)puVar12 + 1) = sVar3 + -1;
    *(BYTE *)(puVar12 + 1) = out[(int)local_208 - 1];
    iVar11 = FT_Write(local_230->ftHandle,puVar12,3,&local_254);
    if (iVar11 != 0) {
      operator_delete(puVar12,1);
      operator_delete(pbVar13,1);
      operator_delete(local_250,1);
      operator_delete(out,1);
      psVar19 = local_248;
      (local_248->_M_dataplus)._M_p = (pointer)local_218;
      bVar7 = false;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"");
      uVar20 = 0;
      goto LAB_00111187;
    }
  }
  bVar1 = out[(int)local_208 - 1];
  *puVar12 = 0x6e;
  *(byte *)(puVar12 + 1) = (bVar1 >> sVar3) << 7 | 3;
  iVar11 = FT_Write(pJVar6->ftHandle,puVar12,3,&local_254);
  psVar19 = local_248;
  if (iVar11 == 0) {
    iVar11 = local_21c - (iVar9 == (int)local_228);
    local_210 = (ulong)uVar20;
    do {
      iVar10 = FT_GetQueueStatus(local_230->ftHandle,&local_23c);
      pbVar5 = local_250;
      if (local_23c == iVar11 + 2) break;
    } while (iVar10 == 0);
    iVar11 = FT_Read(local_230->ftHandle,local_250,local_23c,&local_240);
    uVar20 = local_21c;
    bVar7 = iVar11 == 0;
    if (bVar7) {
      memcpy(pbVar13,pbVar5,(ulong)(local_21c + (local_21c == 0)));
      psVar19 = local_248;
      uVar20 = uVar20 + (uVar20 == 0);
      if (iVar9 == (int)local_228) {
        pbVar13[uVar20] = local_250[local_240 - 1] >> 7;
      }
      else {
        bVar4 = local_250[uVar20] >> (8 - (byte)local_210 & 0x1f);
        bVar1 = local_250[local_240 - 1];
        pbVar13[uVar20] = bVar4;
        pbVar13[uVar20] = bVar1 >> (((byte)local_210 ^ 7) & 0x1f) | bVar4;
      }
      uVar20 = uVar20 + 1;
      operator_delete(out,1);
    }
    else {
      operator_delete(puVar12,1);
      operator_delete(pbVar13,1);
      operator_delete(pbVar5,1);
      operator_delete(out,1);
      psVar19 = local_248;
      (local_248->_M_dataplus)._M_p = (pointer)local_218;
      bVar7 = false;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"");
      uVar20 = 0;
    }
  }
  else {
    operator_delete(puVar12,1);
    operator_delete(pbVar13,1);
    operator_delete(local_250,1);
    operator_delete(out,1);
    (psVar19->_M_dataplus)._M_p = (pointer)local_218;
    bVar7 = false;
    std::__cxx11::string::_M_construct<char_const*>((string *)psVar19,"");
    uVar20 = 0;
  }
LAB_00111187:
  if (bVar7) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    for (uVar21 = (ulong)uVar20; 0 < (long)uVar21; uVar21 = uVar21 - 1) {
      lVar15 = *(long *)(local_1a8[0] + -0x18);
      if (acStack_c8[lVar15 + 1] == '\0') {
        cVar8 = std::ios::widen((char)(ostream *)local_1a8 + (char)lVar15);
        acStack_c8[lVar15] = cVar8;
        acStack_c8[lVar15 + 1] = '\x01';
      }
      acStack_c8[lVar15] = '0';
      *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 2;
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
      std::ostream::operator<<((ostream *)local_1a8,(uint)pbVar13[uVar21 - 1]);
    }
    std::__cxx11::stringbuf::str();
    pbVar5 = local_250;
    if (psVar19->_M_string_length - 1 == local_200->_M_string_length) {
      std::__cxx11::string::substr((ulong)local_1d8,(ulong)psVar19);
      std::__cxx11::string::operator=((string *)psVar19,(string *)local_1d8);
      if (local_1d8[0] != local_1c8) {
        operator_delete(local_1d8[0],local_1c8[0] + 1);
      }
    }
    operator_delete(puVar12,1);
    operator_delete(pbVar13,1);
    operator_delete(pbVar5,1);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return psVar19;
}

Assistant:

string Jtag::shiftData(unsigned int bitCount, string tdi) {
	FT_STATUS ftStatus;
	unsigned int reqBytes = bitCount / 8 + (bitCount % 8 > 0);
	BYTE *byOutputBuffer = new BYTE[reqBytes + 3];
	BYTE *tdoBuffer = new BYTE[reqBytes + 3];
	BYTE *byInputBuffer = new BYTE[reqBytes + 6];
	DWORD dwNumBytesSent = 0;
	DWORD dwNumBytesToRead = 0;
	DWORD dwNumBytesRead = 0;
	DWORD tdoBytes = 0;

	unsigned int reqHex = bitCount / 4 + (bitCount % 4 > 0);

	if (tdi.length() < reqHex)
		return "";

	if (!flush())
		return "";

	if (bitCount < 9) {
		int data = stoi(tdi, 0, 16);
		byOutputBuffer[0] = 0x3B;
		byOutputBuffer[1] = bitCount - 2;
		byOutputBuffer[2] = data & 0xff;
		ftStatus = FT_Write(ftHandle, byOutputBuffer, 3, &dwNumBytesSent);
		if (ftStatus != FT_OK) {
			delete byOutputBuffer;
			delete tdoBuffer;
			delete byInputBuffer;
			return "";
		}

		BYTE lastBit = (data >> ((bitCount - 1) % 8)) & 0x01;

		byOutputBuffer[0] = 0x6E;
		byOutputBuffer[1] = 0x00;
		byOutputBuffer[2] = 0x03 | (lastBit << 7);
		ftStatus = FT_Write(ftHandle, byOutputBuffer, 3, &dwNumBytesSent);
		if (ftStatus != FT_OK) {
			delete byOutputBuffer;
			delete tdoBuffer;
			delete byInputBuffer;
			return "";
		}

		do {
			ftStatus = FT_GetQueueStatus(ftHandle, &dwNumBytesToRead);
			// Get the number of bytes in the device input buffer
		} while ((dwNumBytesToRead == 0) && (ftStatus == FT_OK));
		//or Timeout
		ftStatus = FT_Read(ftHandle, byInputBuffer, dwNumBytesToRead,
				&dwNumBytesRead);
		if (ftStatus != FT_OK) {
			delete byOutputBuffer;
			delete tdoBuffer;
			delete byInputBuffer;
			return "";
		}

		tdoBuffer[0] = byInputBuffer[0] >> (8 - (bitCount - 1));
		tdoBuffer[0] |= byInputBuffer[1] >> (7 - (bitCount - 1));
		tdoBytes = 1;

	} else {
		BYTE *tdiBytes = new BYTE[reqBytes + 1];
		hexToByte(tdi, tdiBytes);

		unsigned int fullBytes = (bitCount - 1) / 8;
		unsigned int remBytes = fullBytes;
		unsigned int offset = 0;

		if (fullBytes > 65536) {
			cout << "Large transfers with reads may not work!" << endl;
		}

		while (remBytes > 0) {
			unsigned int bct = remBytes > 65536 ? 65536 : remBytes;
			byOutputBuffer[0] = 0x39;
			byOutputBuffer[1] = (bct - 1) & 0xff;
			byOutputBuffer[2] = ((bct - 1) >> 8) & 0xff;

			for (unsigned int i = 0; i < bct; i++) {
				byOutputBuffer[3 + i] = tdiBytes[i + offset];
			}

			ftStatus = FT_Write(ftHandle, byOutputBuffer, 3 + bct,
					&dwNumBytesSent);
			if (ftStatus != FT_OK) {
				delete byOutputBuffer;
				delete tdoBuffer;
				delete byInputBuffer;
				delete tdiBytes;
				return "";
			}

			remBytes -= bct;
			offset += bct;
		}

		unsigned int partialBits = bitCount - 1 - (fullBytes * 8);

		if (fullBytes * 8 + 1 != bitCount) {
			byOutputBuffer[0] = 0x3B;
			byOutputBuffer[1] = partialBits - 1;
			byOutputBuffer[2] = tdiBytes[reqBytes - 1] & 0xff;
			ftStatus = FT_Write(ftHandle, byOutputBuffer, 3, &dwNumBytesSent);
			if (ftStatus != FT_OK) {
				delete byOutputBuffer;
				delete tdoBuffer;
				delete byInputBuffer;
				delete tdiBytes;
				return "";
			}
		}

		BYTE lastBit = (tdiBytes[reqBytes - 1] >> ((bitCount - 1) % 8)) & 0x01;

		byOutputBuffer[0] = 0x6E;
		byOutputBuffer[1] = 0x00;
		byOutputBuffer[2] = 0x03 | (lastBit << 7);
		ftStatus = FT_Write(ftHandle, byOutputBuffer, 3, &dwNumBytesSent);
		if (ftStatus != FT_OK) {
			delete byOutputBuffer;
			delete tdoBuffer;
			delete byInputBuffer;
			delete tdiBytes;
			return "";
		}

		DWORD bytesToRead = fullBytes
				+ ((fullBytes * 8 + 1 != bitCount) ? 2 : 1);
		do {
			ftStatus = FT_GetQueueStatus(ftHandle, &dwNumBytesToRead);
			// Get the number of bytes in the device input buffer
		} while ((dwNumBytesToRead != bytesToRead) && (ftStatus == FT_OK));
		//or Timeout
		ftStatus = FT_Read(ftHandle, byInputBuffer, dwNumBytesToRead,
				&dwNumBytesRead);
		if (ftStatus != FT_OK) {
			delete byOutputBuffer;
			delete tdoBuffer;
			delete byInputBuffer;
			delete tdiBytes;
			return "";
		}

		for (unsigned int i = 0; i < fullBytes; i++)
			tdoBuffer[tdoBytes++] = byInputBuffer[i];

		if (fullBytes * 8 + 1 != bitCount) {
			tdoBuffer[tdoBytes] = byInputBuffer[tdoBytes] >> (8 - partialBits);
			tdoBuffer[tdoBytes++] |= byInputBuffer[dwNumBytesRead - 1]
					>> (7 - partialBits);
		} else {
			tdoBuffer[tdoBytes++] = byInputBuffer[dwNumBytesRead - 1] >> 7;
		}

		delete tdiBytes;
	}

	//Read out the data from input buffer
	std::stringstream ss;
	for (int i = tdoBytes - 1; i >= 0; i--)
		ss << setfill('0') << setw(2) << hex << (int) tdoBuffer[i];
	string hexTdo = ss.str();
	if (hexTdo.length() - 1 == tdi.length())
		hexTdo = hexTdo.substr(1, hexTdo.length() - 1);

	delete byOutputBuffer;
	delete tdoBuffer;
	delete byInputBuffer;
	return hexTdo;
}